

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rply.c
# Opt level: O0

p_ply ply_open_from_file(FILE *fp,p_ply_error_cb error_cb,long idata,void *pdata)

{
  int iVar1;
  void *in_RCX;
  long in_RDX;
  p_ply_error_cb in_RSI;
  FILE *in_RDI;
  p_ply ply;
  p_ply_error_cb local_18;
  p_ply local_8;
  
  local_18 = in_RSI;
  if (in_RSI == (p_ply_error_cb)0x0) {
    local_18 = ply_error_cb;
  }
  iVar1 = ply_type_check();
  if (iVar1 == 0) {
    (*local_18)((p_ply)0x0,"Incompatible type system");
    local_8 = (p_ply)0x0;
  }
  else {
    local_8 = ply_alloc();
    if (local_8 == (p_ply)0x0) {
      (*local_18)((p_ply)0x0,"Out of memory");
      local_8 = (p_ply)0x0;
    }
    else {
      local_8->idata = in_RDX;
      local_8->pdata = in_RCX;
      local_8->io_mode = PLY_READ;
      local_8->error_cb = local_18;
      local_8->fp = in_RDI;
      local_8->own_fp = 0;
    }
  }
  return local_8;
}

Assistant:

p_ply ply_open_from_file(FILE *fp, p_ply_error_cb error_cb,
        long idata, void *pdata) {
    p_ply ply;
    if (error_cb == NULL) error_cb = ply_error_cb;
    assert(fp);
    if (!ply_type_check()) {
        error_cb(NULL, "Incompatible type system");
        return NULL;
    }
    ply = ply_alloc();
    if (!ply) {
        error_cb(NULL, "Out of memory");
        return NULL;
    }
    ply->idata = idata;
    ply->pdata = pdata;
    ply->io_mode = PLY_READ;
    ply->error_cb = error_cb;
    ply->fp = fp;
    ply->own_fp = 0;
    return ply;
}